

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

int cc_normalize(int cc)

{
  int local_c;
  int cc_local;
  
  switch(cc) {
  case 6:
    local_c = 4;
    break;
  case 7:
    local_c = 4;
    break;
  default:
    local_c = cc;
    break;
  case 0xe:
    local_c = 0xc;
    break;
  case 0xf:
    local_c = 0xc;
    break;
  case 0x26:
    local_c = 0x24;
    break;
  case 0x27:
    local_c = 0x24;
    break;
  case 0x2e:
    local_c = 0x2c;
    break;
  case 0x2f:
    local_c = 0x2c;
    break;
  case 0x46:
    local_c = 0x44;
    break;
  case 0x47:
    local_c = 0x44;
    break;
  case 0x4e:
    local_c = 0x4c;
    break;
  case 0x4f:
    local_c = 0x4c;
    break;
  case 0x66:
    local_c = 100;
    break;
  case 0x67:
    local_c = 100;
    break;
  case 0x6e:
    local_c = 0x6c;
    break;
  case 0x6f:
    local_c = 0x6c;
  }
  return local_c;
}

Assistant:

static int cc_normalize(int cc)
{
	switch(cc) {
		default: return cc;
		case PPC_BC_LT_MINUS: return PPC_BC_LT;
		case PPC_BC_LE_MINUS: return PPC_BC_LE;
		case PPC_BC_EQ_MINUS: return PPC_BC_EQ;
		case PPC_BC_GE_MINUS: return PPC_BC_GE;
		case PPC_BC_GT_MINUS: return PPC_BC_GT;
		case PPC_BC_NE_MINUS: return PPC_BC_NE;
		case PPC_BC_UN_MINUS: return PPC_BC_UN;
		case PPC_BC_NU_MINUS: return PPC_BC_NU;
		case PPC_BC_LT_PLUS : return PPC_BC_LT;
		case PPC_BC_LE_PLUS : return PPC_BC_LE;
		case PPC_BC_EQ_PLUS : return PPC_BC_EQ;
		case PPC_BC_GE_PLUS : return PPC_BC_GE;
		case PPC_BC_GT_PLUS : return PPC_BC_GT;
		case PPC_BC_NE_PLUS : return PPC_BC_NE;
		case PPC_BC_UN_PLUS : return PPC_BC_UN;
		case PPC_BC_NU_PLUS : return PPC_BC_NU;
	}
}